

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

bool __thiscall
slang::parsing::Lexer::scanUTF8Char(Lexer *this,bool alreadyErrored,uint32_t *code,int *computedLen)

{
  long lVar1;
  char *pcVar2;
  long *plVar3;
  int *piVar4;
  int *in_RCX;
  byte in_SIL;
  long in_RDI;
  char *next;
  long spaceLeft;
  uint32_t *in_stack_00000028;
  char buf [4];
  char *curr;
  int error;
  int local_5c;
  long local_58;
  char *in_stack_ffffffffffffffb0;
  Lexer *in_stack_ffffffffffffffb8;
  DiagCode in_stack_ffffffffffffffc4;
  int local_2c;
  bool local_1;
  
  lVar1 = *(long *)(in_RDI + 0x60);
  if (*(long *)(in_RDI + 0x60) + 4U < *(ulong *)(in_RDI + 0x68)) {
    pcVar2 = utf8Decode(curr,in_stack_00000028,(int *)spaceLeft,(int *)next);
    *(char **)(in_RDI + 0x60) = pcVar2;
  }
  else {
    memset(&stack0xffffffffffffffc4,0,4);
    in_stack_ffffffffffffffb8 = (Lexer *)((*(long *)(in_RDI + 0x68) - *(long *)(in_RDI + 0x60)) - 1)
    ;
    memcpy(&stack0xffffffffffffffc4,*(void **)(in_RDI + 0x60),(size_t)in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffb0 = utf8Decode(curr,in_stack_00000028,(int *)spaceLeft,(int *)next);
    local_58 = (long)in_stack_ffffffffffffffb0 - (long)&stack0xffffffffffffffc4;
    plVar3 = std::min<long>(&local_58,(long *)&stack0xffffffffffffffb8);
    *(long *)(in_RDI + 0x60) = *plVar3 + *(long *)(in_RDI + 0x60);
    local_5c = (int)in_stack_ffffffffffffffb8;
    piVar4 = std::min<int>(in_RCX,&local_5c);
    *in_RCX = *piVar4;
  }
  if (local_2c == 0) {
    local_1 = true;
  }
  else {
    if ((*in_RCX < 2) || ('\x1f' < *(char *)(lVar1 + 1))) {
      if ((*in_RCX < 3) || ('\x1f' < *(char *)(lVar1 + 2))) {
        if ((3 < *in_RCX) && (*(char *)(lVar1 + 3) < ' ')) {
          *(long *)(in_RDI + 0x60) = lVar1 + 3;
        }
      }
      else {
        *(long *)(in_RDI + 0x60) = lVar1 + 2;
      }
    }
    else {
      *(long *)(in_RDI + 0x60) = lVar1 + 1;
    }
    if ((in_SIL & 1) == 0) {
      addDiag(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc4,(size_t)in_stack_ffffffffffffffb0)
      ;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Lexer::scanUTF8Char(bool alreadyErrored, uint32_t* code, int& computedLen) {
    int error;
    auto curr = sourceBuffer;
    if (sourceBuffer + 4 < sourceEnd) {
        sourceBuffer = utf8Decode(sourceBuffer, code, &error, computedLen);
    }
    else {
        char buf[4] = {};
        auto spaceLeft = sourceEnd - sourceBuffer - 1;
        memcpy(buf, sourceBuffer, size_t(spaceLeft));

        auto next = utf8Decode(buf, code, &error, computedLen);
        sourceBuffer += std::min(next - buf, spaceLeft);
        computedLen = std::min(computedLen, (int)spaceLeft);
    }

    if (error) {
        // if error, trim next pointer so that control char is read as next char
        if ((computedLen > 1) && (curr[1] < 0x20))
            sourceBuffer = curr + 1;
        else if ((computedLen > 2) && (curr[2] < 0x20))
            sourceBuffer = curr + 2;
        else if ((computedLen > 3) && (curr[3] < 0x20))
            sourceBuffer = curr + 3;

        if (!alreadyErrored)
            addDiag(diag::InvalidUTF8Seq, (size_t)(curr - originalBegin));
        return false;
    }

    return true;
}